

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5WriteFinish(Fts5Index *p,Fts5SegWriter *pWriter,int *pnLeaf)

{
  undefined8 *puVar1;
  Fts5DlidxWriter *pFVar2;
  long lVar3;
  long lVar4;
  
  if (p->rc == 0) {
    if (4 < (pWriter->writer).buf.n) {
      fts5WriteFlushLeaf(p,pWriter);
    }
    *pnLeaf = (pWriter->writer).pgno + -1;
    if (1 < (pWriter->writer).pgno) {
      fts5WriteFlushBtree(p,pWriter);
    }
  }
  sqlite3_free((pWriter->writer).term.p);
  (pWriter->writer).term.p = (u8 *)0x0;
  (pWriter->writer).term.n = 0;
  (pWriter->writer).term.nSpace = 0;
  sqlite3_free((pWriter->writer).buf.p);
  (pWriter->writer).buf.p = (u8 *)0x0;
  (pWriter->writer).buf.n = 0;
  (pWriter->writer).buf.nSpace = 0;
  sqlite3_free((pWriter->writer).pgidx.p);
  (pWriter->writer).pgidx.p = (u8 *)0x0;
  (pWriter->writer).pgidx.n = 0;
  (pWriter->writer).pgidx.nSpace = 0;
  sqlite3_free((pWriter->btterm).p);
  (pWriter->btterm).p = (u8 *)0x0;
  (pWriter->btterm).n = 0;
  (pWriter->btterm).nSpace = 0;
  if (0 < pWriter->nDlidx) {
    lVar3 = 0x10;
    lVar4 = 0;
    do {
      pFVar2 = pWriter->aDlidx;
      sqlite3_free(*(void **)((long)&pFVar2->pgno + lVar3));
      puVar1 = (undefined8 *)((long)&pFVar2->pgno + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < pWriter->nDlidx);
  }
  sqlite3_free(pWriter->aDlidx);
  return;
}

Assistant:

static void fts5WriteFinish(
  Fts5Index *p,
  Fts5SegWriter *pWriter,         /* Writer object */
  int *pnLeaf                     /* OUT: Number of leaf pages in b-tree */
){
  int i;
  Fts5PageWriter *pLeaf = &pWriter->writer;
  if( p->rc==SQLITE_OK ){
    assert( pLeaf->pgno>=1 );
    if( pLeaf->buf.n>4 ){
      fts5WriteFlushLeaf(p, pWriter);
    }
    *pnLeaf = pLeaf->pgno-1;
    if( pLeaf->pgno>1 ){
      fts5WriteFlushBtree(p, pWriter);
    }
  }
  fts5BufferFree(&pLeaf->term);
  fts5BufferFree(&pLeaf->buf);
  fts5BufferFree(&pLeaf->pgidx);
  fts5BufferFree(&pWriter->btterm);

  for(i=0; i<pWriter->nDlidx; i++){
    sqlite3Fts5BufferFree(&pWriter->aDlidx[i].buf);
  }
  sqlite3_free(pWriter->aDlidx);
}